

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fShaderAtomicOpTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::ShaderAtomicXorCase::getInputs
          (ShaderAtomicXorCase *this,int numValues,int stride,void *inputs)

{
  bool bVar1;
  deUint32 dVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  int localNdx;
  int iVar6;
  long lVar7;
  int iVar8;
  Random rnd;
  
  dVar2 = deStringHash((this->super_ShaderAtomicOpCase).super_TestCase.super_TestCase.super_TestNode
                       .m_name._M_dataplus._M_p);
  deRandom_init(&rnd.m_rnd,dVar2);
  iVar4 = (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[1] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[2] *
          (this->super_ShaderAtomicOpCase).m_workGroupSize.m_data[0];
  uVar3 = (long)numValues / (long)iVar4 & 0xffffffff;
  uVar5 = 0;
  if ((int)((long)numValues / (long)iVar4) < 1) {
    uVar3 = 0;
  }
  iVar6 = stride;
  for (; uVar5 != uVar3; uVar5 = uVar5 + 1) {
    dVar2 = deRandom_getUint32(&rnd.m_rnd);
    *(deUint32 *)((long)inputs + (long)(iVar4 * (int)uVar5 * stride)) = dVar2;
    iVar8 = iVar6;
    for (lVar7 = 1; lVar7 < iVar4; lVar7 = lVar7 + 1) {
      bVar1 = de::Random::getBool((Random *)&rnd.m_rnd);
      *(uint *)((long)inputs + (long)iVar8) = -(uint)bVar1;
      iVar8 = iVar8 + stride;
    }
    iVar6 = iVar6 + iVar4 * stride;
  }
  return;
}

Assistant:

void getInputs (int numValues, int stride, void* inputs) const
	{
		de::Random		rnd				(deStringHash(getName()));
		const int		workGroupSize	= (int)product(m_workGroupSize);
		const int		numWorkGroups	= numValues/workGroupSize;

		for (int groupNdx = 0; groupNdx < numWorkGroups; groupNdx++)
		{
			const int groupOffset = groupNdx*workGroupSize;

			// First uses random bit-pattern.
			*(deUint32*)((deUint8*)inputs + stride*(groupOffset)) = rnd.getUint32();

			// Rest have either all or no bits set.
			for (int localNdx = 1; localNdx < workGroupSize; localNdx++)
				*(deUint32*)((deUint8*)inputs + stride*(groupOffset+localNdx)) = rnd.getBool() ? ~0u : 0u;
		}
	}